

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O2

void __thiscall flatbuffers::Registry::AddIncludeDirectory(Registry *this,char *path)

{
  char *local_8;
  
  local_8 = path;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            (&this->include_paths_,&local_8);
  return;
}

Assistant:

void AddIncludeDirectory(const char *path) { include_paths_.push_back(path); }